

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotErrorBarsEx<ImPlot::GetterError<float>>(char *label_id,GetterError<float> *getter)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  ImPlotPlot *pIVar11;
  double dVar12;
  double dVar13;
  ImPlotContext *pIVar14;
  bool bVar15;
  ImU32 col;
  long lVar16;
  ImDrawList *this;
  int iVar17;
  int iVar18;
  int iVar19;
  ImPlotRange *pIVar20;
  double dVar21;
  float fVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  double dVar25;
  double dVar26;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar15 = BeginItem(label_id,-1);
  pIVar14 = GImPlot;
  if (bVar15) {
    if ((GImPlot->FitThisFrame == true) && (iVar17 = getter->Count, 0 < iVar17)) {
      pfVar7 = getter->Xs;
      pfVar8 = getter->Ys;
      iVar19 = getter->Offset;
      iVar3 = getter->Stride;
      pfVar9 = getter->Neg;
      pfVar10 = getter->Pos;
      pIVar11 = GImPlot->CurrentPlot;
      iVar4 = pIVar11->CurrentYAxis;
      uVar5 = (pIVar11->XAxis).Flags;
      pIVar20 = GImPlot->ExtentsY + iVar4;
      uVar6 = pIVar11->YAxis[iVar4].Flags;
      iVar18 = 0;
      do {
        lVar16 = (long)(((iVar19 + iVar18) % iVar17 + iVar17) % iVar17) * (long)iVar3;
        fVar1 = *(float *)((long)pfVar7 + lVar16);
        dVar12 = (double)*(float *)((long)pfVar8 + lVar16);
        fVar22 = *(float *)((long)pfVar10 + lVar16);
        dVar21 = (double)fVar1;
        dVar13 = dVar12 - (double)*(float *)((long)pfVar9 + lVar16);
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_00200baf:
            if ((0.0 < fVar1) || ((uVar5 & 0x20) == 0)) {
              dVar25 = (pIVar14->ExtentsX).Min;
              dVar26 = dVar21;
              if (dVar25 <= dVar21) {
                dVar26 = dVar25;
              }
              (pIVar14->ExtentsX).Min = dVar26;
              dVar25 = (pIVar14->ExtentsX).Max;
              dVar26 = dVar21;
              if (dVar21 <= dVar25) {
                dVar26 = dVar25;
              }
              (pIVar14->ExtentsX).Max = dVar26;
            }
          }
        }
        else if ((((long)ABS(dVar21) < 0x7ff0000000000000) &&
                 (pIVar11->YAxis[iVar4].Range.Min <= dVar13)) &&
                (dVar13 <= pIVar11->YAxis[iVar4].Range.Max)) goto LAB_00200baf;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar13) < 0x7ff0000000000000) {
LAB_00200c1e:
            if ((0.0 < dVar13) || ((uVar6 & 0x20) == 0)) {
              dVar25 = dVar13;
              if (pIVar20->Min <= dVar13) {
                dVar25 = pIVar20->Min;
              }
              pIVar20->Min = dVar25;
              dVar25 = pIVar14->ExtentsY[iVar4].Max;
              if (dVar13 <= dVar25) {
                dVar13 = dVar25;
              }
              pIVar14->ExtentsY[iVar4].Max = dVar13;
            }
          }
        }
        else if ((((long)ABS(dVar13) < 0x7ff0000000000000) && ((pIVar11->XAxis).Range.Min <= dVar21)
                 ) && (dVar21 <= (pIVar11->XAxis).Range.Max)) goto LAB_00200c1e;
        dVar12 = dVar12 + (double)fVar22;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_00200c7b:
            if ((0.0 < fVar1) || ((uVar5 & 0x20) == 0)) {
              dVar13 = (pIVar14->ExtentsX).Min;
              dVar25 = dVar21;
              if (dVar13 <= dVar21) {
                dVar25 = dVar13;
              }
              (pIVar14->ExtentsX).Min = dVar25;
              dVar13 = (pIVar14->ExtentsX).Max;
              dVar25 = dVar21;
              if (dVar21 <= dVar13) {
                dVar25 = dVar13;
              }
              (pIVar14->ExtentsX).Max = dVar25;
            }
          }
        }
        else if ((((long)ABS(dVar21) < 0x7ff0000000000000) &&
                 (pIVar11->YAxis[iVar4].Range.Min <= dVar12)) &&
                (dVar12 <= pIVar11->YAxis[iVar4].Range.Max)) goto LAB_00200c7b;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar12) < 0x7ff0000000000000) {
LAB_00200cec:
            if ((0.0 < dVar12) || ((uVar6 & 0x20) == 0)) {
              uVar23 = SUB84(dVar12,0);
              uVar24 = (undefined4)((ulong)dVar12 >> 0x20);
              dVar21 = pIVar20->Min;
              if (dVar21 <= dVar12) {
                uVar23 = SUB84(dVar21,0);
                uVar24 = (undefined4)((ulong)dVar21 >> 0x20);
              }
              pIVar20->Min = (double)CONCAT44(uVar24,uVar23);
              dVar21 = pIVar14->ExtentsY[iVar4].Max;
              if (dVar12 <= dVar21) {
                dVar12 = dVar21;
              }
              pIVar14->ExtentsY[iVar4].Max = dVar12;
            }
          }
        }
        else if ((((long)ABS(dVar12) < 0x7ff0000000000000) && ((pIVar11->XAxis).Range.Min <= dVar21)
                 ) && (dVar21 <= (pIVar11->XAxis).Range.Max)) goto LAB_00200cec;
        iVar18 = iVar18 + 1;
      } while (iVar17 != iVar18);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar14->NextItemData).Colors + 4);
    iVar17 = getter->Count;
    if (0 < iVar17) {
      fVar1 = (pIVar14->NextItemData).ErrorBarSize;
      fVar22 = fVar1 * 0.5;
      iVar19 = 0;
      do {
        lVar16 = (long)(((getter->Offset + iVar19) % iVar17 + iVar17) % iVar17) *
                 (long)getter->Stride;
        dVar21 = (double)*(float *)((long)getter->Xs + lVar16);
        dVar12 = (double)*(float *)((long)getter->Ys + lVar16);
        fVar2 = *(float *)((long)getter->Pos + lVar16);
        local_40 = PlotToPixels(dVar21,dVar12 - (double)*(float *)((long)getter->Neg + lVar16),-1);
        local_48 = PlotToPixels(dVar21,(double)fVar2 + dVar12,-1);
        ImDrawList::AddLine(this,&local_40,&local_48,col,(pIVar14->NextItemData).ErrorBarWeight);
        if (0.0 < fVar1) {
          local_50.x = local_40.x - fVar22;
          local_50.y = local_40.y;
          local_38.y = local_40.y + 0.0;
          local_38.x = fVar22 + local_40.x;
          ImDrawList::AddLine(this,&local_50,&local_38,col,(pIVar14->NextItemData).ErrorBarWeight);
          local_50.x = local_48.x - fVar22;
          local_50.y = local_48.y;
          local_38.y = local_48.y + 0.0;
          local_38.x = fVar22 + local_48.x;
          ImDrawList::AddLine(this,&local_50,&local_38,col,(pIVar14->NextItemData).ErrorBarWeight);
        }
        iVar19 = iVar19 + 1;
        iVar17 = getter->Count;
      } while (iVar19 < iVar17);
    }
    pIVar14 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar14->NextItemData);
    pIVar14->PreviousItem = pIVar14->CurrentItem;
    pIVar14->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotErrorBarsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPointError e = getter(i);
                FitPoint(ImPlotPoint(e.X , e.Y - e.Neg));
                FitPoint(ImPlotPoint(e.X , e.Y + e.Pos ));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_ErrorBar]);
        const bool rend_whisker  = s.ErrorBarSize > 0;
        const float half_whisker = s.ErrorBarSize * 0.5f;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPointError e = getter(i);
            ImVec2 p1 = PlotToPixels(e.X, e.Y - e.Neg);
            ImVec2 p2 = PlotToPixels(e.X, e.Y + e.Pos);
            DrawList.AddLine(p1,p2,col, s.ErrorBarWeight);
            if (rend_whisker) {
                DrawList.AddLine(p1 - ImVec2(half_whisker, 0), p1 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
                DrawList.AddLine(p2 - ImVec2(half_whisker, 0), p2 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
            }
        }
        EndItem();
    }
}